

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

UINT16 TPMU_SENSITIVE_COMPOSITE_Marshal
                 (TPMU_SENSITIVE_COMPOSITE *source,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT32 selector_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMU_SENSITIVE_COMPOSITE *source_local;
  
  switch(selector) {
  case 1:
    source_local._6_2_ = TPM2B_PRIVATE_KEY_RSA_Marshal(&source->rsa,buffer,size);
    break;
  default:
    source_local._6_2_ = 0;
    break;
  case 8:
    source_local._6_2_ = TPM2B_SENSITIVE_DATA_Marshal(&source->bits,buffer,size);
    break;
  case 0x23:
    source_local._6_2_ = TPM2B_ECC_PARAMETER_Marshal(&source->ecc,buffer,size);
    break;
  case 0x25:
    source_local._6_2_ = TPM2B_SYM_KEY_Marshal(&source->sym,buffer,size);
  }
  return source_local._6_2_;
}

Assistant:

UINT16
TPMU_SENSITIVE_COMPOSITE_Marshal(TPMU_SENSITIVE_COMPOSITE *source, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_RSA
        case TPM_ALG_RSA:
            return TPM2B_PRIVATE_KEY_RSA_Marshal((TPM2B_PRIVATE_KEY_RSA *)&(source->rsa), buffer, size);
#endif // ALG_RSA
#if         ALG_ECC
        case TPM_ALG_ECC:
            return TPM2B_ECC_PARAMETER_Marshal((TPM2B_ECC_PARAMETER *)&(source->ecc), buffer, size);
#endif // ALG_ECC
#if         ALG_KEYEDHASH
        case TPM_ALG_KEYEDHASH:
            return TPM2B_SENSITIVE_DATA_Marshal((TPM2B_SENSITIVE_DATA *)&(source->bits), buffer, size);
#endif // ALG_KEYEDHASH
#if         ALG_SYMCIPHER
        case TPM_ALG_SYMCIPHER:
            return TPM2B_SYM_KEY_Marshal((TPM2B_SYM_KEY *)&(source->sym), buffer, size);
#endif // ALG_SYMCIPHER
    }
    return 0;
}